

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgsky(fitsfile *fptr,char *keyname,int firstchar,int maxchar,char *value,int *valuelen,
          char *comm,int *status)

{
  uint uVar1;
  size_t sVar2;
  fitsfile *fptr_00;
  int in_ECX;
  int in_EDX;
  fitsfile *in_R8;
  char *in_R9;
  char *in_stack_00000008;
  size_t len;
  int keynum;
  int addCommDelim;
  int commSpace;
  int contin;
  char *tempstring;
  char card [81];
  char nextcomm [73];
  char valstring [71];
  int *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  int *in_stack_fffffffffffffeb8;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffecc;
  int iVar6;
  char *local_130;
  char local_128 [88];
  int *in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff38;
  char cVar7;
  undefined7 in_stack_ffffffffffffff39;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  char local_78 [56];
  int *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  if (*(int *)len < 1) {
    *(undefined1 *)&in_R8->HDUposition = 0;
    if (in_R9 != (char *)0x0) {
      in_R9[0] = '\0';
      in_R9[1] = '\0';
      in_R9[2] = '\0';
      in_R9[3] = '\0';
    }
    local_128[0] = '\0';
    if (in_stack_00000008 != (char *)0x0) {
      *in_stack_00000008 = '\0';
    }
    ffgcrd(in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (*(int *)len < 1) {
      sVar2 = strlen(local_128);
      if (sVar2 < 0x50) {
        uVar4 = 1;
      }
      ffpsvc(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (char *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
      if (*(int *)len < 1) {
        if (in_stack_00000008 != (char *)0x0) {
          sVar2 = strlen(in_stack_00000008);
          iVar5 = 0x48 - (int)sVar2;
        }
        if (local_78[0] == '\0') {
          local_130 = (char *)malloc(1);
          *local_130 = '\0';
        }
        else {
          sVar2 = strlen(local_78);
          local_130 = (char *)malloc(sVar2 + 1);
          ffc2s((char *)CONCAT44(in_stack_fffffffffffffecc,iVar5),(char *)CONCAT44(uVar4,uVar3),
                in_stack_fffffffffffffeb8);
          fptr_00 = (fitsfile *)strlen(local_130);
          iVar6 = 1;
          while( true ) {
            uVar1 = in_stack_fffffffffffffeb4 & 0xffffff;
            if (iVar6 != 0) {
              uVar1 = CONCAT13(*(int *)len < 1,(int3)in_stack_fffffffffffffeb4);
            }
            in_stack_fffffffffffffeb4 = uVar1;
            if ((char)(in_stack_fffffffffffffeb4 >> 0x18) == '\0') break;
            if ((fptr_00 == (fitsfile *)0x0) || ((local_130 + -1)[(long)fptr_00] != '&')) {
              iVar6 = 0;
            }
            else {
              local_78[0] = '\0';
              cVar7 = '\0';
              ffgcnt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff50);
              if ((local_78[0] == '\0') && (cVar7 == '\0')) {
                iVar6 = 0;
              }
              else {
                (local_130 + -1)[(long)fptr_00] = '\0';
                if (local_78[0] != '\0') {
                  sVar2 = strlen(local_78);
                  fptr_00 = (fitsfile *)((sVar2 - 1) + (long)fptr_00);
                  local_130 = (char *)realloc(local_130,(size_t)((long)&fptr_00->HDUposition + 1));
                  strcat(local_130,local_78);
                }
                if (((cVar7 != '\0') && (0 < iVar5)) && (cVar7 != '\0')) {
                  sVar2 = strlen(in_stack_00000008);
                  if ((sVar2 != 0) && (uVar4 != 0)) {
                    strcat(in_stack_00000008," ");
                    iVar5 = iVar5 + -1;
                  }
                  strncat(in_stack_00000008,&stack0xffffffffffffff38,(long)iVar5);
                  sVar2 = strlen(in_stack_00000008);
                  iVar5 = 0x48 - (int)sVar2;
                }
                ffghps(fptr_00,(int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8,(int *)0x1be3d8);
                ffgrec(fptr_00,in_stack_fffffffffffffeb4,(char *)in_stack_fffffffffffffea8,
                       (int *)0x1be3f9);
                sVar2 = strlen(local_128);
                uVar4 = (uint)(sVar2 < 0x50);
              }
            }
          }
        }
        if (local_130 != (char *)0x0) {
          sVar2 = strlen(local_130);
          if ((ulong)(long)in_EDX <= sVar2) {
            strncat((char *)in_R8,local_130 + (in_EDX + -1),(long)in_ECX);
          }
          uVar3 = (undefined4)sVar2;
          free(local_130);
          if (in_R9 != (char *)0x0) {
            *(undefined4 *)in_R9 = uVar3;
          }
        }
        local_4 = *(int *)len;
      }
      else {
        local_4 = *(int *)len;
      }
    }
    else {
      local_4 = *(int *)len;
    }
  }
  else {
    local_4 = *(int *)len;
  }
  return local_4;
}

Assistant:

int ffgsky( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int firstchar,       /* I - first character of string to return */
           int maxchar,         /* I - maximum length of string to return */
	                        /*    (string will be null terminated)  */      
           char *value,         /* O - pointer to keyword value      */
           int *valuelen,       /* O - total length of the keyword value string */
                                /*     The returned 'value' string may only */
				/*     contain a piece of the total string, depending */
				/*     on the value of firstchar and maxchar */
           char *comm,          /* O - keyword comment (may be NULL) */
           int  *status)        /* IO - error status                 */
/*
  Read and return the value of the specified string-valued keyword.
  
  This new routine was added in 2016 to provide a more convenient user
  interface than the older ffgkls routine.

  Read a string keyword, returning up to 'naxchars' characters of the value
  starting with the 'firstchar' character.
  The input 'value' string must be allocated at least 1 char bigger to
  allow for the terminating null character.
  
  This routine may be used to read continued string keywords that use 
  the CONTINUE keyword convention, as well as normal string keywords
  that are contained within a single header record.
  
  This routine differs from the ffkls routine in that it does not
  internally allocate memory for the returned value string, and consequently
  the calling routine does not need to call fffree to free the memory.
*/
{
    char valstring[FLEN_VALUE], nextcomm[FLEN_COMMENT], card[FLEN_CARD];
    char *tempstring;
    int contin, commSpace = 0, addCommDelim=0, keynum=0;
    size_t len;

    if (*status > 0)
        return(*status);

    tempstring = NULL;  /* initialize in case of error */
    *value = '\0';
    if (valuelen) *valuelen = 0;
    
    card[0] = '\0';
    if (comm)
       comm[0] = '\0';
    ffgcrd(fptr, keyname, card, status);
    if (*status > 0)
       return(*status);
    if (strlen(card) < FLEN_CARD-1)
       addCommDelim=1;
    ffpsvc(card,valstring, comm, status);    
    if (*status > 0)
        return(*status);

    if (comm)
    {
        /* remaining space in comment string */
        commSpace = FLEN_COMMENT-1 - strlen(comm);
    }
    
    if (!valstring[0])   /* null value string? */
    {
      tempstring = (char *) malloc(1);  /* allocate and return a null string */
      *tempstring = '\0';
    }
    else
    {
      /* allocate space,  plus 1 for null */
      tempstring = (char *) malloc(strlen(valstring) + 1);

      ffc2s(valstring, tempstring, status);   /* convert string to value */
      len = strlen(tempstring);

      /* If last character is a & then value may be continued on next keyword */
      contin = 1;
      while (contin && *status <= 0)  
      {
        if (len && *(tempstring+len-1) == '&')  /*  is last char an ampersand?  */
        {
            valstring[0] = '\0';
            nextcomm[0] = '\0';
            ffgcnt(fptr, valstring, nextcomm, status);
            if (*valstring || *nextcomm)  /* If either valstring or nextcom
                                  is filled, this must be a CONTINUE line */  
            {
               *(tempstring+len-1) = '\0';         /* erase the trailing & char */
               if (*valstring)
               {
                  len += strlen(valstring) - 1;
                  tempstring = (char *) realloc(tempstring, len + 1); /* increase size */
                  strcat(tempstring, valstring);     /* append the continued chars */
               }
               if (*nextcomm)
               {
	          if ((commSpace > 0) && (*nextcomm != 0)) 
	          {
                     /* If in here, input 'comm' cannot be 0 */
                     /* concantenate comment strings (if any) */
                     if (strlen(comm) && addCommDelim)
                     {
                        strcat(comm, " ");
                        commSpace -=1;
                     }
		     strncat(comm, nextcomm, commSpace);
                     commSpace = FLEN_COMMENT-1 - strlen(comm);
                  }
               }
               /* Determine if a space delimiter is needed for next
                  comment concatenation (if any).  Assume it is if card length
                  of the most recently read keyword is less than max. 
                  keynum is 1-based. */
               ffghps(fptr,0,&keynum,status);
               ffgrec(fptr, keynum-1, card, status);
               addCommDelim = (strlen(card) < FLEN_CARD-1) ? 1 : 0;
            }
            else
	    {
                contin = 0;
            }
        }
        else
	{
            contin = 0;
	}
      }
    }
    
    if (tempstring) 
    {
        len = strlen(tempstring);
	if (firstchar <= len)
            strncat(value, tempstring + (firstchar - 1), maxchar);
        free(tempstring);
	if (valuelen) *valuelen = len;  /* total length of the keyword value */
    }
    
    return(*status);
}